

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_68f06::IntrusiveListIteratorTest::SetUp(IntrusiveListIteratorTest *this)

{
  size_t sVar1;
  TestObject *pTVar2;
  TestObject *pTVar3;
  
  (anonymous_namespace)::TestObject::creation_count = 0;
  pTVar2 = (TestObject *)operator_new(0x20);
  (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ = (TestObject *)0x0;
  (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = (TestObject *)0x0;
  pTVar2->data = 1;
  pTVar2->data2 = 0;
  pTVar2->moved = false;
  (anonymous_namespace)::TestObject::creation_count = 1;
  if (((pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ ==
       (TestObject *)0x0) &&
     ((pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ ==
      (TestObject *)0x0)) {
    pTVar3 = (this->list_).last_;
    if (pTVar3 == (TestObject *)0x0) {
      pTVar3 = (TestObject *)&this->list_;
    }
    else {
      (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = pTVar3;
    }
    (pTVar3->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ = pTVar2;
    (this->list_).last_ = pTVar2;
    sVar1 = (this->list_).size_;
    (this->list_).size_ = sVar1 + 1;
    pTVar3 = (TestObject *)operator_new(0x20);
    (pTVar3->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ = (TestObject *)0x0
    ;
    (pTVar3->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = (TestObject *)0x0
    ;
    pTVar3->data = 2;
    pTVar3->data2 = 0;
    pTVar3->moved = false;
    (anonymous_namespace)::TestObject::creation_count = 2;
    if (((pTVar3->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ ==
         (TestObject *)0x0) &&
       ((pTVar3->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ ==
        (TestObject *)0x0)) {
      (pTVar3->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = pTVar2;
      (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ = pTVar3;
      (this->list_).last_ = pTVar3;
      (this->list_).size_ = sVar1 + 2;
      pTVar2 = (TestObject *)operator_new(0x20);
      (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
           (TestObject *)0x0;
      (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ =
           (TestObject *)0x0;
      pTVar2->data = 3;
      pTVar2->data2 = 0;
      pTVar2->moved = false;
      (anonymous_namespace)::TestObject::creation_count = 3;
      if (((pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ ==
           (TestObject *)0x0) &&
         ((pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ ==
          (TestObject *)0x0)) {
        (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = pTVar3;
        (pTVar3->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ = pTVar2;
        (this->list_).last_ = pTVar2;
        (this->list_).size_ = sVar1 + 3;
        return;
      }
    }
  }
  __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                ,0x1bd,
                "void wabt::intrusive_list<(anonymous namespace)::TestObject>::push_back(std::unique_ptr<T>) [T = (anonymous namespace)::TestObject]"
               );
}

Assistant:

virtual void SetUp() {
    IntrusiveListTest::SetUp();

    list_.emplace_back(1);
    list_.emplace_back(2);
    list_.emplace_back(3);
  }